

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::convertTo32(Image *this)

{
  _func_void_uint8_ptr_uint8_ptr *pixels_00;
  int iVar1;
  uint8 *__ptr;
  int local_54;
  _func_void_uint8_ptr_uint8_ptr *p_Stack_50;
  int x;
  uint8 *newline;
  uint8 *line;
  int y;
  uint8 *pixels32;
  _func_void_uint8_ptr_uint8_ptr *fun;
  uint8 *newpixels;
  uint8 *puStack_18;
  int32 newstride;
  uint8 *pixels;
  Image *this_local;
  
  puStack_18 = this->pixels;
  iVar1 = this->width * 4;
  switch(this->depth) {
  case 4:
  case 8:
    unpalettize(this,true);
    return;
  default:
    return;
  case 0x10:
    pixels32 = (uint8 *)conv_RGBA8888_from_ARGB1555;
    break;
  case 0x18:
    pixels32 = (uint8 *)conv_RGBA8888_from_RGB888;
  }
  __ptr = (uint8 *)0x30018;
  pixels_00 = (_func_void_uint8_ptr_uint8_ptr *)
              mustmalloc_LOC((long)(iVar1 * this->height),0x30018,
                             "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 650"
                            );
  fun = pixels_00;
  for (line._4_4_ = 0; line._4_4_ < this->height; line._4_4_ = line._4_4_ + 1) {
    newline = puStack_18;
    p_Stack_50 = fun;
    for (local_54 = 0; local_54 < this->width; local_54 = local_54 + 1) {
      __ptr = newline;
      (*(code *)pixels32)(p_Stack_50);
      newline = newline + this->bpp;
      p_Stack_50 = p_Stack_50 + 4;
    }
    puStack_18 = puStack_18 + this->stride;
    fun = fun + iVar1;
  }
  free(this,__ptr);
  this->depth = 0x20;
  this->bpp = 4;
  this->stride = iVar1;
  this->pixels = (uint8 *)0x0;
  this->palette = (uint8 *)0x0;
  setPixels(this,(uint8 *)pixels_00);
  return;
}

Assistant:

void
Image::convertTo32(void)
{
	assert(this->pixels);
	uint8 *pixels = this->pixels;
	int32 newstride = this->width*4;
	uint8 *newpixels;

	void (*fun)(uint8 *out, uint8 *in) = nil;
	switch(this->depth){
	case 4:
	case 8:
		assert(this->palette);
		this->unpalettize(true);
		return;
	case 16:
		fun = conv_RGBA8888_from_ARGB1555;
		break;
	case 24:
		fun = conv_RGBA8888_from_RGB888;
		break;
	default:
		return;
	}

	newpixels = rwNewT(uint8, newstride*this->height, MEMDUR_EVENT | ID_IMAGE);
	uint8 *pixels32 = newpixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		uint8 *newline = newpixels;
		for(int x = 0; x < this->width; x++){
			fun(newline, line);
			line += this->bpp;
			newline += 4;
		}
		pixels += this->stride;
		newpixels += newstride;
	}

	this->free();
	this->depth = 32;
	this->bpp = 4;
	this->stride = newstride;
	this->pixels = nil;
	this->palette = nil;
	this->setPixels(pixels32);
}